

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__node
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *text_00;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  byte *pbVar6;
  StringHash SVar7;
  undefined4 uVar8;
  byte *pbVar9;
  long lVar10;
  xmlChar **ppxVar11;
  bool failed;
  bool local_51;
  XSList<GeneratedSaxParser::ParserString> *local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  pbVar6 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x38);
  uVar1 = node__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar6 = node__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(pbVar6 + 8) = uVar1;
  uVar1 = node__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(pbVar6 + 0x10) = node__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(pbVar6 + 0x18) = uVar1;
  uVar3 = node__AttributeData::DEFAULT._44_4_;
  uVar2 = node__AttributeData::DEFAULT._40_4_;
  uVar8 = node__AttributeData::DEFAULT._36_4_;
  *(undefined4 *)(pbVar6 + 0x20) = node__AttributeData::DEFAULT._32_4_;
  *(undefined4 *)(pbVar6 + 0x24) = uVar8;
  *(undefined4 *)(pbVar6 + 0x28) = uVar2;
  *(undefined4 *)(pbVar6 + 0x2c) = uVar3;
  *(undefined8 *)(pbVar6 + 0x30) = node__AttributeData::DEFAULT._48_8_;
  *attributeDataPtr = pbVar6;
  ppxVar11 = attributes->attributes;
  if (ppxVar11 != (xmlChar **)0x0) {
    local_50 = (XSList<GeneratedSaxParser::ParserString> *)(pbVar6 + 0x28);
    local_40 = pbVar6 + 0x18;
    local_48 = pbVar6 + 0x10;
    local_38 = pbVar6 + 8;
    do {
      text = *ppxVar11;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar7 = GeneratedSaxParser::Utils::calculateStringHash(text);
        text_00 = ppxVar11[1];
        ppxVar11 = ppxVar11 + 2;
        if ((long)SVar7 < 0x74835) {
          pbVar9 = local_38;
          if ((SVar7 == 0x6f4) || (pbVar9 = local_40, SVar7 == 0x79f4)) {
LAB_00749250:
            *(ParserChar **)pbVar9 = text_00;
          }
          else {
LAB_00749300:
            bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_UNKNOWN_ATTRIBUTE,0x755a5,text,text_00);
            validationDataPtr = (void **)0x1;
            if (bVar5) goto LAB_00749255;
          }
        }
        else {
          if (SVar7 == 0x728fc2) {
            bVar5 = GeneratedSaxParser::
                    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                    ::
                    characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                              (&this->
                                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ,text_00,local_50);
            if (bVar5) {
              *pbVar6 = *pbVar6 | 1;
              validationDataPtr = (void **)0x4;
              bVar5 = true;
            }
            else {
              bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x755a5,0x728fc2,text_00);
              bVar5 = !bVar5;
              validationDataPtr = (void **)(ulong)((uint)bVar5 + (uint)bVar5 * 2 + 1);
            }
            if (bVar5) goto LAB_00749253;
            goto LAB_00749255;
          }
          if (SVar7 != 0x7c065) {
            pbVar9 = local_48;
            if (SVar7 == 0x74835) goto LAB_00749250;
            goto LAB_00749300;
          }
          SVar7 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_51);
          lVar10 = 0;
          bVar5 = false;
          do {
            if (*(StringHash *)((long)&ENUM__node_enumMap + lVar10) == SVar7) {
              local_51 = false;
              validationDataPtr = (void **)(ulong)*(uint *)((long)&DAT_0085b398 + lVar10);
            }
            uVar8 = SUB84(validationDataPtr,0);
            if (*(StringHash *)((long)&ENUM__node_enumMap + lVar10) == SVar7) break;
            lVar10 = lVar10 + 0x10;
            bVar5 = lVar10 != 0x10;
          } while (lVar10 == 0x10);
          if (bVar5) {
            local_51 = true;
            uVar8 = 2;
          }
          *(undefined4 *)(pbVar6 + 0x20) = uVar8;
          if (local_51 == true) {
            bVar5 = false;
            bVar4 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x755a5,0x7c065,text_00);
            if (!bVar4) goto LAB_0074932c;
            validationDataPtr = (void **)0x1;
          }
          else {
LAB_0074932c:
            validationDataPtr = (void **)0x4;
            bVar5 = true;
          }
          if (!bVar5) goto LAB_00749255;
        }
LAB_00749253:
        validationDataPtr = (void **)0x0;
      }
LAB_00749255:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((*pbVar6 & 1) == 0) {
    pbVar6[0x28] = 0;
    pbVar6[0x29] = 0;
    pbVar6[0x2a] = 0;
    pbVar6[0x2b] = 0;
    pbVar6[0x2c] = 0;
    pbVar6[0x2d] = 0;
    pbVar6[0x2e] = 0;
    pbVar6[0x2f] = 0;
    pbVar6[0x30] = 0;
    pbVar6[0x31] = 0;
    pbVar6[0x32] = 0;
    pbVar6[0x33] = 0;
    pbVar6[0x34] = 0;
    pbVar6[0x35] = 0;
    pbVar6[0x36] = 0;
    pbVar6[0x37] = 0;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__node( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__node( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

node__AttributeData* attributeData = newData<node__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_SID:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__sid_type(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_NODE,
            HASH_ATTRIBUTE_SID,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_TYPE:
    {
bool failed;
attributeData->type = Utils::toEnum<ENUM__node_enum, StringHash, ENUM__node_enum__COUNT>(attributeValue, failed, ENUM__node_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_NODE,
        HASH_ATTRIBUTE_TYPE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_LAYER:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->layer, &validate__Name, HASH_ELEMENT_NODE, HASH_ATTRIBUTE_LAYER);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->layer);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->layer);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_NODE,
        HASH_ATTRIBUTE_LAYER,
        attributeValue))
{
    return false;
}

if ( !failed )
    attributeData->present_attributes |= node__AttributeData::ATTRIBUTE_LAYER_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_NODE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & node__AttributeData::ATTRIBUTE_LAYER_PRESENT) == 0)
{
    attributeData->layer = GeneratedSaxParser::XSList<ParserString>();
}


    return true;
}